

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_181a83::PluralTableSink::put
          (PluralTableSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  char *__s1;
  UBool UVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  int i;
  long lVar5;
  int32_t len;
  ResourceTable pluralsTable;
  int32_t local_bc;
  char *local_b8;
  ConstChar16Ptr local_b0;
  char16_t *local_a8;
  ResourceTable local_98;
  UnicodeString local_70;
  
  local_b8 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_98,value,status,CONCAT71(in_register_00000009,param_3));
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar1 = icu_63::ResourceTable::getKeyAndValue(&local_98,0,&local_b8,value), UVar1 != '\0')) {
    i = 1;
    do {
      __s1 = local_b8;
      iVar3 = strcmp(local_b8,"dnam");
      if (iVar3 == 0) {
        lVar5 = 6;
      }
      else {
        iVar3 = strcmp(__s1,"per");
        if (iVar3 == 0) {
          lVar5 = 7;
        }
        else {
          iVar4 = icu_63::StandardPlural::indexFromString(__s1,status);
          lVar5 = (long)iVar4;
        }
      }
      bVar2 = true;
      if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
         (bVar2 = false,
         (undefined1  [56])((undefined1  [56])this->outArray[lVar5].fUnion & (undefined1  [56])0x1)
         != (undefined1  [56])0x0)) {
        local_bc = 0;
        iVar3 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_bc,status);
        local_b0.p_ = (char16_t *)CONCAT44(extraout_var,iVar3);
        icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_b0,local_bc);
        local_a8 = local_b0.p_;
        icu_63::UnicodeString::moveFrom(this->outArray + lVar5,&local_70);
        icu_63::UnicodeString::~UnicodeString(&local_70);
        bVar2 = U_ZERO_ERROR < *status;
      }
      if (bVar2) {
        return;
      }
      UVar1 = icu_63::ResourceTable::getKeyAndValue(&local_98,i,&local_b8,value);
      i = i + 1;
    } while (UVar1 != '\0');
  }
  return;
}

Assistant:

void put(const char *key, ResourceValue &value, UBool /*noFallback*/, UErrorCode &status) U_OVERRIDE {
        ResourceTable pluralsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int32_t i = 0; pluralsTable.getKeyAndValue(i, key, value); ++i) {
            int32_t index = getIndex(key, status);
            if (U_FAILURE(status)) { return; }
            if (!outArray[index].isBogus()) {
                continue;
            }
            outArray[index] = value.getUnicodeString(status);
            if (U_FAILURE(status)) { return; }
        }
    }